

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

string * to_str_abi_cxx11_(string *__return_storage_ptr__,uchar c)

{
  int iVar1;
  ostream *this;
  ostringstream *this_00;
  int iVar2;
  undefined7 in_register_00000031;
  ostringstream strm;
  
  this_00 = (ostringstream *)&strm;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  iVar1 = isprint(iVar2);
  if (iVar1 == 0) {
    this = std::operator<<((ostream *)&strm,'<');
    this_00 = (ostringstream *)std::ostream::operator<<(this,iVar2);
    c = '>';
  }
  std::operator<<((ostream *)this_00,c);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strm);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_str(unsigned char c)
{
	std::ostringstream strm;
	if (isprint(c)) strm << c;
	else            strm << '<' << int(c) << '>';
	return strm.str();
}